

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.c
# Opt level: O0

int vorbis_synthesis_trackonly(vorbis_block *vb,ogg_packet *op)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  oggpack_buffer *b_00;
  long lVar4;
  int mode;
  oggpack_buffer *opb;
  codec_setup_info *ci;
  vorbis_info *vi;
  private_state *b;
  vorbis_dsp_state *vd;
  ogg_packet *op_local;
  vorbis_block *vb_local;
  
  pvVar1 = vb->vd->backend_state;
  pvVar2 = vb->vd->vi->codec_setup;
  b_00 = &vb->opb;
  _vorbis_block_ripcord(vb);
  oggpack_readinit(b_00,op->packet,(int)op->bytes);
  lVar4 = oggpack_read(b_00,1);
  if (lVar4 == 0) {
    lVar4 = oggpack_read(b_00,*(int *)((long)pvVar1 + 0x50));
    iVar3 = (int)lVar4;
    if (iVar3 == -1) {
      vb_local._4_4_ = -0x88;
    }
    else {
      vb->mode = iVar3;
      if (*(long *)((long)pvVar2 + (long)iVar3 * 8 + 0x28) == 0) {
        vb_local._4_4_ = -0x88;
      }
      else {
        vb->W = (long)**(int **)((long)pvVar2 + (long)iVar3 * 8 + 0x28);
        if (vb->W == 0) {
          vb->lW = 0;
          vb->nW = 0;
        }
        else {
          lVar4 = oggpack_read(b_00,1);
          vb->lW = lVar4;
          lVar4 = oggpack_read(b_00,1);
          vb->nW = lVar4;
          if (vb->nW == -1) {
            return -0x88;
          }
        }
        vb->granulepos = op->granulepos;
        vb->sequence = op->packetno;
        vb->eofflag = (int)op->e_o_s;
        vb->pcmend = 0;
        vb->pcm = (float **)0x0;
        vb_local._4_4_ = 0;
      }
    }
  }
  else {
    vb_local._4_4_ = -0x87;
  }
  return vb_local._4_4_;
}

Assistant:

int vorbis_synthesis_trackonly(vorbis_block *vb,ogg_packet *op){
  vorbis_dsp_state     *vd=vb->vd;
  private_state        *b=vd->backend_state;
  vorbis_info          *vi=vd->vi;
  codec_setup_info     *ci=vi->codec_setup;
  oggpack_buffer       *opb=&vb->opb;
  int                   mode;

  /* first things first.  Make sure decode is ready */
  _vorbis_block_ripcord(vb);
  oggpack_readinit(opb,op->packet,op->bytes);

  /* Check the packet type */
  if(oggpack_read(opb,1)!=0){
    /* Oops.  This is not an audio data packet */
    return(OV_ENOTAUDIO);
  }

  /* read our mode and pre/post windowsize */
  mode=oggpack_read(opb,b->modebits);
  if(mode==-1)return(OV_EBADPACKET);

  vb->mode=mode;
  if(!ci->mode_param[mode]){
    return(OV_EBADPACKET);
  }

  vb->W=ci->mode_param[mode]->blockflag;
  if(vb->W){
    vb->lW=oggpack_read(opb,1);
    vb->nW=oggpack_read(opb,1);
    if(vb->nW==-1)   return(OV_EBADPACKET);
  }else{
    vb->lW=0;
    vb->nW=0;
  }

  /* more setup */
  vb->granulepos=op->granulepos;
  vb->sequence=op->packetno;
  vb->eofflag=op->e_o_s;

  /* no pcm */
  vb->pcmend=0;
  vb->pcm=NULL;

  return(0);
}